

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  byte bVar1;
  uint32_t uVar2;
  anon_class_40_5_beb31822 add;
  anon_class_40_5_beb31822 add_00;
  anon_class_40_5_beb31822 add_01;
  char cVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  char *pcVar8;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  unsigned_long extraout_RDX_01;
  unsigned_long uVar9;
  code *unaff_RBX;
  byte *p;
  uint uVar10;
  EpsCopyInputStream *this_00;
  int iVar11;
  undefined8 unaff_R12;
  uint uVar12;
  InternalMetadata *unaff_R13;
  byte *pbVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  pair<const_char_*,_int> pVar17;
  pair<const_char_*,_unsigned_long> pVar18;
  RepeatedField<int> *this_01;
  code *pcVar19;
  undefined8 uVar20;
  InternalMetadata *this_02;
  uint32_t uStack_a8;
  undefined1 auStack_a0 [72];
  ulong uStack_58;
  ulong uStack_50;
  undefined8 local_40;
  RepeatedField<int> *pRStack_38;
  
  uVar15 = this->depth_;
  uVar10 = uVar15 - 1;
  this->depth_ = uVar10;
  if ((int)uVar15 < 1) {
LAB_001471e9:
    pcVar8 = (char *)0x0;
  }
  else {
    uVar12 = this->group_depth_;
    uVar14 = uVar12 + 1;
    this->group_depth_ = uVar14;
    uStack_50._0_4_ = 0x1471c6;
    uStack_50._4_4_ = 0;
    pcVar4 = MessageLite::_InternalParse(msg,ptr,this);
    if (pcVar4 == (char *)0x0) {
      uVar12 = this->group_depth_ - 1;
      uVar15 = this->depth_ + 1;
    }
    else {
      pbVar5 = (byte *)(ulong)(uint)this->depth_;
      if (uVar10 != this->depth_) {
        this_00 = (EpsCopyInputStream *)(ulong)uVar10;
        uStack_50._0_4_ = 0x147233;
        uStack_50._4_4_ = 0;
        ParseGroup();
        bVar1 = *pbVar5;
        p = (byte *)(ulong)bVar1;
        auStack_a0._40_8_ = (ulong)tag;
        auStack_a0._48_8_ = (ulong)uVar15;
        auStack_a0._56_8_ = (ulong)uVar12;
        auStack_a0._64_8_ = this;
        uStack_58 = (ulong)uVar14;
        uStack_50 = (ulong)uVar10;
        if ((char)bVar1 < '\0') {
          pVar17 = ReadSizeFallback((char *)pbVar5,(uint)bVar1);
          pbVar5 = (byte *)pVar17.first;
          if (pbVar5 == (byte *)0x0) {
            return (char *)0x0;
          }
          p = (byte *)(ulong)(uint)pVar17.second;
        }
        else {
          pbVar5 = pbVar5 + 1;
        }
        pcVar4 = this_00->buffer_end_;
        iVar11 = (int)pcVar4 - (int)pbVar5;
        if (iVar11 < (int)p) {
          do {
            add.is_valid = (EnumValidityFuncWithArg *)pRStack_38;
            add.object = (void *)local_40;
            add.data = unaff_RBX;
            add.metadata = (InternalMetadata *)unaff_R12;
            add._32_8_ = unaff_R13;
            this_01 = pRStack_38;
            pcVar19 = unaff_RBX;
            uVar20 = unaff_R12;
            this_02 = unaff_R13;
            pcVar4 = ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                               ((char *)pbVar5,pcVar4,add);
            if (pcVar4 == (char *)0x0) {
              return (char *)0x0;
            }
            pcVar8 = this_00->buffer_end_;
            uVar15 = (int)pcVar4 - (int)pcVar8;
            if (0x10 < uVar15) {
              EpsCopyInputStream::
              ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                        ((EpsCopyInputStream *)auStack_a0);
LAB_001473dd:
              pbVar5 = auStack_a0;
              EpsCopyInputStream::
              ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                        ();
              uVar9 = extraout_RDX;
              if (pbVar5 <= p) {
                return (char *)p;
              }
              do {
                uVar16 = (ulong)(char)*p;
                if ((long)uVar16 < 0) {
                  pVar18 = VarintParseSlow64((char *)p,(uint)*p);
                  uVar16 = pVar18.second;
                  if (pVar18.first == (char *)0x0) {
                    return (char *)0x0;
                  }
                }
                else {
                  pVar18.second = uVar9;
                  pVar18.first = (char *)(p + 1);
                }
                p = (byte *)pVar18.first;
                cVar3 = (*pcVar19)(uVar20,uVar16 & 0xffffffff);
                if (cVar3 == '\0') {
                  if ((this_02->ptr_ & 1U) == 0) {
                    s = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(this_02)
                    ;
                  }
                  else {
                    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((this_02->ptr_ & 0xfffffffffffffffeU) + 8);
                  }
                  WriteVarint(uStack_a8,(long)(int)uVar16,s);
                  uVar9 = extraout_RDX_01;
                }
                else {
                  RepeatedField<int>::Add(this_01,(int)uVar16);
                  uVar9 = extraout_RDX_00;
                }
              } while (p < pbVar5);
              return (char *)p;
            }
            iVar7 = (int)p - iVar11;
            if (iVar7 < 0x11) {
              auStack_a0._16_8_ = (char *)0x0;
              auStack_a0._24_2_ = 0;
              auStack_a0._0_8_ = *(undefined8 *)pcVar8;
              auStack_a0._8_8_ = *(undefined8 *)(pcVar8 + 8);
              add_01.is_valid = (EnumValidityFuncWithArg *)pRStack_38;
              add_01.object = (void *)local_40;
              add_01.data = unaff_RBX;
              add_01.metadata = (InternalMetadata *)unaff_R12;
              add_01._32_8_ = unaff_R13;
              pcVar4 = ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                                 (auStack_a0 + (uVar15 & 0x1f),auStack_a0 + iVar7,add_01);
              if (pcVar4 != auStack_a0 + iVar7) {
                return (char *)0x0;
              }
              return this_00->buffer_end_ + ((long)pcVar4 - (long)auStack_a0);
            }
            uVar10 = (int)p - (iVar11 + uVar15);
            p = (byte *)(ulong)uVar10;
            if ((int)uVar10 < 1) goto LAB_001473dd;
            if (this_00->limit_ < 0x11) {
              return (char *)0x0;
            }
            pcVar4 = EpsCopyInputStream::Next(this_00);
            if (pcVar4 == (char *)0x0) {
              return (char *)0x0;
            }
            pbVar5 = (byte *)(pcVar4 + (uVar15 & 0x1f));
            pcVar4 = this_00->buffer_end_;
            iVar11 = (int)pcVar4 - (int)pbVar5;
          } while (iVar11 < (int)uVar10);
        }
        add_00.is_valid = (EnumValidityFuncWithArg *)pRStack_38;
        add_00.object = (void *)local_40;
        add_00.data = unaff_RBX;
        add_00.metadata = (InternalMetadata *)unaff_R12;
        add_00._32_8_ = unaff_R13;
        pbVar6 = (byte *)ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                                   ((char *)pbVar5,(char *)(pbVar5 + (int)p),add_00);
        pbVar13 = (byte *)0x0;
        if (pbVar5 + (int)p == pbVar6) {
          pbVar13 = pbVar6;
        }
        return (char *)pbVar13;
      }
      if (uVar14 != this->group_depth_) {
        uStack_50._0_4_ = 0x1471e9;
        uStack_50._4_4_ = 0;
        ParseGroup();
        goto LAB_001471e9;
      }
    }
    this->group_depth_ = uVar12;
    this->depth_ = uVar15;
    uVar2 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar8 = (char *)0x0;
    if (uVar2 == tag) {
      pcVar8 = pcVar4;
    }
  }
  return pcVar8;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      MessageLite* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }